

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_int8
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  long in_R8;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  Mat A_tile;
  int i;
  int ppj;
  Mat A_tileX;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  size_t in_stack_fffffffffffffb68;
  Allocator *in_stack_fffffffffffffb70;
  void **ppvVar2;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  Mat *pMVar3;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  Mat *in_stack_fffffffffffffb90;
  int *in_stack_fffffffffffffbc0;
  int *in_stack_fffffffffffffbc8;
  int *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  Allocator *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbf0;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  Allocator *local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  Mat local_3b8;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  Mat local_358;
  int local_30c;
  int local_308;
  void *local_2f8;
  int *local_2f0;
  ulong local_2e8;
  int local_2e0;
  Allocator *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  undefined4 local_2c0;
  long local_2b8;
  int local_2ac;
  int local_2a8 [2];
  int local_2a0 [3];
  int local_294;
  long local_290;
  int local_284;
  long *local_280;
  Mat *local_278;
  undefined1 local_26d;
  int local_26c;
  undefined8 *local_260;
  undefined1 local_255;
  int local_254;
  void **local_250;
  Mat *local_248;
  undefined8 *local_230;
  Mat *local_220;
  Mat *local_210;
  void **local_200;
  Allocator *local_1f0;
  int local_1e4;
  ulong local_1e0;
  void *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  Mat *local_1c0;
  Allocator *local_1b8;
  int local_1ac;
  size_t local_1a8;
  long local_1a0;
  undefined4 local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  undefined4 local_17c;
  long local_178;
  undefined4 local_16c;
  long local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_130;
  undefined4 local_12c;
  Mat *local_128;
  int local_110;
  undefined4 local_10c;
  Mat *local_108;
  undefined8 *local_e8;
  void *local_a0;
  void *local_90;
  void *local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined4 local_58;
  int local_54;
  void **local_50;
  int local_44;
  undefined8 *local_40;
  Mat *local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  Mat *local_8;
  
  local_2a0[1] = 0x10;
  local_2a0[2] = in_EDX;
  local_294 = in_ECX;
  local_290 = in_R8;
  local_284 = in_EDX;
  local_280 = in_RSI;
  local_278 = in_RDI;
  get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0,
             (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbf0);
  local_2ac = (local_294 + -1 + local_2a0[0]) / local_2a0[0];
  local_54 = local_2a0[0] * local_2a8[0] * 0x10;
  local_5c = *(undefined4 *)(local_290 + 4);
  local_50 = &local_2f8;
  local_58 = 1;
  local_68 = 2;
  local_70 = 0;
  local_2f8 = (void *)0x0;
  local_2f0 = (int *)0x0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_2d8 = (Allocator *)0x0;
  local_2d0 = 0;
  local_2cc = 0;
  local_2c8 = 0;
  local_2c4 = 0;
  local_2c0 = 0;
  local_2b8 = 0;
  Mat::create(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
              (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
              in_stack_fffffffffffffb70);
  Mat::create(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,
              (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),(int)in_stack_fffffffffffffb70,
              in_stack_fffffffffffffb68,in_stack_fffffffffffffbe0);
  for (local_308 = 0; local_308 < local_2ac; local_308 = local_308 + 1) {
    local_30c = local_308 * local_2a0[0];
    local_254 = get_omp_thread_num();
    local_248 = &local_358;
    local_250 = &local_2f8;
    local_1d8 = (void *)((long)local_2f8 + local_2b8 * local_254 * local_2e8);
    local_1c0 = &local_358;
    local_358.refcount = (int *)0x0;
    local_358.elemsize = local_2e8;
    local_358.elempack = local_2e0;
    local_358.allocator = local_2d8;
    local_358.w = local_2cc;
    local_358.h = local_2c8;
    local_358.d = 1;
    local_358.c = local_2c4;
    local_168 = (long)local_2cc * (long)local_2c8 * local_2e8;
    local_358.cstep = (local_168 + 0xfU & 0xfffffffffffffff0) / local_2e8;
    local_358.dims = local_2d0 + -1;
    if (local_2d0 == 4) {
      local_358.cstep = (long)local_2cc * (long)local_2c8;
    }
    local_16c = 0x10;
    local_1c4 = local_2cc;
    local_1c8 = local_2c8;
    local_1cc = local_2c4;
    local_1e0 = local_2e8;
    local_1e4 = local_2e0;
    local_1f0 = local_2d8;
    local_255 = 1;
    local_358.data = local_1d8;
    for (local_35c = 0; local_35c < local_2a0[2]; local_35c = local_2a8[0] + local_35c) {
      local_364 = local_294 - local_30c;
      piVar1 = std::min<int>(&local_364,local_2a0);
      local_360 = *piVar1;
      local_36c = local_2a0[2] - local_35c;
      piVar1 = std::min<int>(&local_36c,local_2a8);
      local_368 = *piVar1;
      conv3x3s1_winograd23_transform_kernel_tile_int8
                (local_278,&local_358,local_284,local_30c,local_360,local_35c,local_368);
      local_26c = local_30c / local_2a0[0];
      local_260 = &local_400;
      local_18c = *(int *)((long)local_280 + 0x2c);
      local_190 = (int)local_280[6];
      local_194 = *(undefined4 *)((long)local_280 + 0x34);
      local_1a0 = *local_280 + local_280[8] * (long)local_26c * local_280[2];
      local_1a8 = local_280[2];
      local_1ac = (int)local_280[3];
      local_1b8 = (Allocator *)local_280[4];
      local_188 = &local_400;
      local_178 = (long)local_18c * (long)local_190 * local_1a8;
      local_44 = local_35c / local_2a8[0];
      local_38 = &local_3b8;
      local_40 = &local_400;
      local_18 = (void *)(local_1a0 + (long)local_18c * (long)local_190 * (long)local_44 * local_1a8
                         );
      local_8 = &local_3b8;
      local_3b8.cstep = (long)local_18c * (long)local_190;
      local_230 = &local_400;
      local_3b8.c = 1;
      local_3b8.d = 1;
      local_3b8.dims = 2;
      local_3b8.refcount = (int *)0x0;
      local_17c = 0x10;
      local_26d = 1;
      local_400 = 0;
      local_3f0 = 0;
      local_3e8 = 0;
      local_3d8 = 0;
      local_3d4 = 0;
      local_3d0 = 0;
      local_3cc = 0;
      local_3c8 = 0;
      local_3c0 = 0;
      local_3f8 = 0;
      local_e8 = local_230;
      local_30 = local_1b8;
      local_24 = local_1ac;
      local_20 = local_1a8;
      local_10 = local_190;
      local_c = local_18c;
      local_3e0 = local_1b8;
      local_3b8.data = local_18;
      local_3b8.elemsize = local_1a8;
      local_3b8.elempack = local_1ac;
      local_3b8.allocator = local_1b8;
      local_3b8.w = local_18c;
      local_3b8.h = local_190;
      pack_A_tile_int8(&local_358,&local_3b8,0x10,local_360,local_368);
      pMVar3 = &local_3b8;
      local_220 = pMVar3;
      local_108 = pMVar3;
      if (local_3b8.refcount != (int *)0x0) {
        local_10c = 0xffffffff;
        LOCK();
        local_110 = *local_3b8.refcount;
        *local_3b8.refcount = *local_3b8.refcount + -1;
        UNLOCK();
        if (local_110 == 1) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            local_a0 = local_3b8.data;
            if (local_3b8.data != (void *)0x0) {
              free(local_3b8.data);
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
          }
        }
      }
      pMVar3->data = (void *)0x0;
      pMVar3->elemsize = 0;
      pMVar3->elempack = 0;
      pMVar3->dims = 0;
      pMVar3->w = 0;
      pMVar3->h = 0;
      pMVar3->d = 0;
      pMVar3->c = 0;
      pMVar3->cstep = 0;
      pMVar3->refcount = (int *)0x0;
    }
    pMVar3 = &local_358;
    local_210 = pMVar3;
    local_128 = pMVar3;
    if (local_358.refcount != (int *)0x0) {
      local_12c = 0xffffffff;
      LOCK();
      local_130 = *local_358.refcount;
      *local_358.refcount = *local_358.refcount + -1;
      UNLOCK();
      if (local_130 == 1) {
        if (local_358.allocator == (Allocator *)0x0) {
          local_90 = local_358.data;
          if (local_358.data != (void *)0x0) {
            free(local_358.data);
          }
        }
        else {
          (*(local_358.allocator)->_vptr_Allocator[3])(local_358.allocator,local_358.data);
        }
      }
    }
    pMVar3->data = (void *)0x0;
    pMVar3->elemsize = 0;
    pMVar3->elempack = 0;
    pMVar3->dims = 0;
    pMVar3->w = 0;
    pMVar3->h = 0;
    pMVar3->d = 0;
    pMVar3->c = 0;
    pMVar3->cstep = 0;
    pMVar3->refcount = (int *)0x0;
  }
  ppvVar2 = &local_2f8;
  if (local_2f0 != (int *)0x0) {
    local_14c = 0xffffffff;
    LOCK();
    local_150 = *local_2f0;
    *local_2f0 = *local_2f0 + -1;
    UNLOCK();
    if (local_150 == 1) {
      local_200 = ppvVar2;
      local_148 = ppvVar2;
      if (local_2d8 == (Allocator *)0x0) {
        local_80 = local_2f8;
        if (local_2f8 != (void *)0x0) {
          free(local_2f8);
        }
      }
      else {
        (*local_2d8->_vptr_Allocator[3])(local_2d8,local_2f8);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd23_transform_kernel_int8_avx2(kernel, AT, inch, outch, opt);
        return;
    }
#endif

    const int M = outch;
    const int K = inch;
    const int B = 16;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 2u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 2u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd23_transform_kernel_tile_int8(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile_int8(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}